

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_data.cpp
# Opt level: O2

void duckdb::ArrowUnionData::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  long lVar2;
  const_reference pvVar3;
  reference pvVar4;
  ArrowArray *pAVar5;
  reference pvVar6;
  LogicalType *type_00;
  ulong __n;
  byte bVar7;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_50;
  child_list_t<LogicalType> local_48;
  
  bVar7 = 0;
  result->n_buffers = 1;
  pAVar1 = ArrowAppendData::GetMainBuffer(append_data);
  *result->buffers = pAVar1->dataptr;
  UnionType::CopyMemberTypes_abi_cxx11_(&local_48,(UnionType *)type,type_00);
  ArrowAppender::AddChildren
            (append_data,
             ((long)local_48.
                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    .
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   .
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  result->children =
       (append_data->child_pointers).super_vector<ArrowArray_*,_std::allocator<ArrowArray_*>_>.
       super__Vector_base<ArrowArray_*,_std::allocator<ArrowArray_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  lVar2 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                    (((long)local_48.
                            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            .
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.
                           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           .
                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x38);
  result->n_children = lVar2;
  for (__n = 0; __n < (ulong)(((long)local_48.
                                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     .
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_48.
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    .
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      __n = __n + 1) {
    pvVar3 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::get<true>(&local_48,__n);
    pvVar4 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
             ::get<true>(&append_data->child_data,__n);
    local_50._M_head_impl =
         (pvVar4->
         super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
         .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
    (pvVar4->
    super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)._M_t.
    super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
    .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
    pAVar5 = ArrowAppender::FinalizeChild
                       (&pvVar3->second,
                        (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                         *)&local_50);
    pvVar6 = vector<ArrowArray,_true>::get<true>(&append_data->child_arrays,__n);
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pvVar6->length = pAVar5->length;
      pAVar5 = (ArrowArray *)((long)pAVar5 + (ulong)bVar7 * -0x10 + 8);
      pvVar6 = (reference)((long)pvVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
    ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
                 *)&local_50);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_48);
  return;
}

Assistant:

void ArrowUnionData::Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
	result->n_buffers = 1;
	result->buffers[0] = append_data.GetMainBuffer().data();

	auto &child_types = UnionType::CopyMemberTypes(type);
	ArrowAppender::AddChildren(append_data, child_types.size());
	result->children = append_data.child_pointers.data();
	result->n_children = NumericCast<int64_t>(child_types.size());
	for (idx_t i = 0; i < child_types.size(); i++) {
		auto &child_type = child_types[i].second;
		append_data.child_arrays[i] = *ArrowAppender::FinalizeChild(child_type, std::move(append_data.child_data[i]));
	}
}